

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_unit.c
# Opt level: O2

void zt_unit_release(zt_unit **unit)

{
  zt_unit_suite *pzVar1;
  zt_unit_suite *pzVar2;
  zt_unit_suite *__ptr;
  zt_unit_suite *tsuite;
  zt_unit_suite *local_20;
  
  __ptr = (zt_unit_suite *)*unit;
  pzVar2 = (zt_unit_suite *)(__ptr->suite).next;
  while (pzVar2 != __ptr) {
    pzVar1 = (zt_unit_suite *)(pzVar2->suite).next;
    local_20 = pzVar2;
    zt_unit_release_suite(&local_20);
    pzVar2 = pzVar1;
    __ptr = (zt_unit_suite *)*unit;
  }
  free(__ptr);
  *unit = (zt_unit *)0x0;
  return;
}

Assistant:

void
zt_unit_release(struct zt_unit **unit)
{
    zt_elist_t * ignore;
    zt_elist_t * tmp;

    zt_assert(unit);
    zt_assert(*unit);

    zt_elist_for_each_safe(&(*unit)->suites, tmp, ignore) {
        struct zt_unit_suite * tsuite = zt_elist_data(tmp, struct zt_unit_suite, suite);

        zt_unit_release_suite(&tsuite);
    }

    zt_free(*unit);
    *unit = NULL;
}